

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OsCompat.cpp
# Opt level: O2

char * __thiscall OsCompat::extname(OsCompat *this,char *str)

{
  char *pcVar1;
  char *__s;
  
  pcVar1 = strrchr(str,0x2e);
  __s = "";
  if ((pcVar1 != (char *)0x0) && ((pcVar1 != str || (*pcVar1 != '.')))) {
    __s = (char *)malloc(0x100);
    snprintf(__s,0x100,"%s",pcVar1 + 1);
  }
  return __s;
}

Assistant:

char * OsCompat::extname(const char *str) {
    char *result;
    char *last;
    char *tmpStr = const_cast<char *>(str);

    if ((last = strrchr(tmpStr, '.')) != nullptr) {
        if ((*last == '.') && (last == tmpStr))
            return "";
        else {
            result = (char*) malloc(_MAX_EXT);
            snprintf(result, _MAX_EXT, "%s", last + 1);
            return result;
        }
    } else {
        return ""; // Empty/nullptr string
    }
}